

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoBackgroundRMatrix.test.cpp
# Opt level: O3

void verifyChunk(NoBackgroundRMatrix *chunk)

{
  uint uVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_a0;
  char *local_90;
  undefined8 local_88;
  undefined8 local_80;
  AssertionHandler local_78;
  
  local_a0._vptr_ITransientExpression = (_func_int **)0x18b45c;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x10;
  capturedExpression.m_start = "0 == chunk.LBK()";
  Catch::AssertionHandler::AssertionHandler
            (&local_78,macroName,(SourceLineInfo *)&local_a0,capturedExpression,ContinueOnFailure);
  local_a0._8_2_ = 0x101;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c44e0;
  local_a0._8_8_ = local_a0._8_8_ & 0xffffffff;
  local_90 = "==";
  local_88 = 2;
  local_80 = (ulong)local_80._4_4_ << 0x20;
  Catch::AssertionHandler::handleExpr(&local_78,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_a0._vptr_ITransientExpression = (_func_int **)0x18b45c;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1b;
  capturedExpression_00.m_start = "0 == chunk.representation()";
  Catch::AssertionHandler::AssertionHandler
            (&local_78,macroName_00,(SourceLineInfo *)&local_a0,capturedExpression_00,
             ContinueOnFailure);
  local_a0._8_2_ = 0x101;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c4520;
  local_a0._8_8_ = local_a0._8_8_ & 0xffffffff;
  local_90 = "==";
  local_88 = 2;
  local_80 = 0;
  Catch::AssertionHandler::handleExpr(&local_78,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_a0._vptr_ITransientExpression = (_func_int **)0x18b45c;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x10;
  capturedExpression_01.m_start = "1 == chunk.LCH()";
  Catch::AssertionHandler::AssertionHandler
            (&local_78,macroName_01,(SourceLineInfo *)&local_a0,capturedExpression_01,
             ContinueOnFailure);
  uVar1 = (chunk->
          super_BaseBackgroundRMatrix<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix>
          ).index_;
  local_a0.m_result = uVar1 == 1;
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c44e0;
  local_a0._12_4_ = 1;
  local_90 = "==";
  local_88 = 2;
  local_80 = CONCAT44(local_80._4_4_,uVar1);
  Catch::AssertionHandler::handleExpr(&local_78,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_a0._vptr_ITransientExpression = (_func_int **)0x18b45c;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x19;
  capturedExpression_02.m_start = "1 == chunk.channelIndex()";
  Catch::AssertionHandler::AssertionHandler
            (&local_78,macroName_02,(SourceLineInfo *)&local_a0,capturedExpression_02,
             ContinueOnFailure);
  uVar1 = (chunk->
          super_BaseBackgroundRMatrix<njoy::ENDFtk::section::Type<2,_151>::RMatrixLimited::NoBackgroundRMatrix>
          ).index_;
  local_a0.m_result = uVar1 == 1;
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c44e0;
  local_a0._12_4_ = 1;
  local_90 = "==";
  local_88 = 2;
  local_80 = CONCAT44(local_80._4_4_,uVar1);
  Catch::AssertionHandler::handleExpr(&local_78,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_a0._vptr_ITransientExpression = (_func_int **)0x18b45c;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0xf;
  capturedExpression_03.m_start = "1 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&local_78,macroName_03,(SourceLineInfo *)&local_a0,capturedExpression_03,
             ContinueOnFailure);
  local_a0._8_2_ = 0x101;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c4520;
  local_a0._12_4_ = 1;
  local_90 = "==";
  local_88 = 2;
  local_80 = 1;
  Catch::AssertionHandler::handleExpr(&local_78,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunk( const NoBackgroundRMatrix& chunk ) {

  CHECK( 0 == chunk.LBK() );
  CHECK( 0 == chunk.representation() );
  CHECK( 1 == chunk.LCH() );
  CHECK( 1 == chunk.channelIndex() );

  CHECK( 1 == chunk.NC() );
}